

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void __thiscall train_context::build_v_diff(train_context *this,bool transpose)

{
  size_type sVar1;
  value_type *__x;
  undefined8 uVar2;
  size_t sVar3;
  value_type pgVar4;
  uchar *__src;
  byte in_SIL;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  float f;
  int ic;
  int ir;
  float *arr;
  ggml_tensor *diff;
  int n_rows;
  int n_elem;
  value_type *diff_tmp;
  int il;
  ggml_tensor *t;
  value_type *__new_size;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  undefined1 local_69 [33];
  string local_48 [32];
  value_type *local_28;
  int local_20;
  int local_1c;
  reference local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  printf("build_v_diff\n");
  for (local_10 = 0;
      local_10 <
      *(int *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish + 4) + -1; local_10 = local_10 + 1)
  {
    local_18 = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&in_RDI[4].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_10);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    local_1c = (int)(sVar1 >> 2);
    if (local_1c %
        *(int *)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
                 ,0xeb,"GGML_ASSERT(%s) failed","n_elem % n_embd == 0");
    }
    local_20 = local_1c /
               *(int *)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
    if ((local_9 & 1) == 0) {
      __x = (value_type *)
            ggml_new_tensor_2d((in_RDI->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start,0,
                               (long)*(int *)&(in_RDI->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data._M_finish,
                               (long)local_20);
    }
    else {
      __x = (value_type *)
            ggml_new_tensor_2d((in_RDI->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start,0,(long)local_20,
                               (long)*(int *)&(in_RDI->
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              )._M_impl.super__Vector_impl_data._M_finish);
    }
    t = (ggml_tensor *)local_69;
    __new_size = __x;
    local_28 = __x;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::__cxx11::to_string(in_stack_ffffffffffffff6c);
    std::operator+(in_stack_ffffffffffffff58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    uVar2 = std::__cxx11::string::c_str();
    ggml_set_name(__x,uVar2);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    sVar3 = ggml_nbytes(local_28);
    pgVar4 = (value_type)malloc(sVar3);
    local_28[0x1f] = pgVar4;
    if ((local_9 & 1) == 0) {
      pgVar4 = local_28[0x1f];
      __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17ef58);
      sVar3 = ggml_nbytes(local_28);
      memcpy(pgVar4,__src,sVar3);
    }
    else {
      in_stack_ffffffffffffff58 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17ee29);
      for (in_stack_ffffffffffffff54 = 0; in_stack_ffffffffffffff54 < local_20;
          in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 + 1) {
        for (in_stack_ffffffffffffff50 = 0;
            in_stack_ffffffffffffff50 <
            *(int *)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1) {
          ggml_set_f32_nd(*(undefined4 *)
                           (&in_stack_ffffffffffffff58->_M_dataplus +
                           (long)(in_stack_ffffffffffffff54 *
                                  *(int *)&(in_RDI->
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           )._M_impl.super__Vector_impl_data._M_finish +
                                 in_stack_ffffffffffffff50) * 4),local_28,in_stack_ffffffffffffff54,
                          in_stack_ffffffffffffff50,0);
        }
      }
    }
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)t,__x);
    print_debug_tensor(t,SUB81((ulong)__x >> 0x38,0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_RDI,(size_type)__new_size)
    ;
  }
  return;
}

Assistant:

void build_v_diff(bool transpose) {
        printf("build_v_diff\n");
        for (int il = 0; il < n_layers - 1; il++) {
            auto & diff_tmp = v_diff_tmp[il];
            int n_elem = diff_tmp.size() / sizeof(float);
            GGML_ASSERT(n_elem % n_embd == 0);
            int n_rows = n_elem / n_embd;
            struct ggml_tensor * diff = transpose
                ? ggml_new_tensor_2d(ctx_ggml, GGML_TYPE_F32, n_rows, n_embd)
                : ggml_new_tensor_2d(ctx_ggml, GGML_TYPE_F32, n_embd, n_rows);
            ggml_set_name(diff, (std::string("diff_") + std::to_string(il)).c_str());
            diff->data = malloc(ggml_nbytes(diff)); // TODO: get rid of this malloc if possible
            if (transpose) {
                // copy data & transpose
                float * arr = (float *) diff_tmp.data();
                for (int ir = 0; ir < n_rows; ++ir) {
                    for (int ic = 0; ic < n_embd; ++ic) {
                        float f = arr[ir*n_embd + ic];
                        ggml_set_f32_nd(diff, ir, ic, 0, 0, f);
                    }
                }
            } else {
                // only copy
                memcpy(diff->data, diff_tmp.data(), ggml_nbytes(diff));
            }
            v_diff.push_back(diff);
            print_debug_tensor(diff);
            // free memory of diff_tmp
            diff_tmp.resize(0);
        }
    }